

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darCore.c
# Opt level: O3

int Dar_ManRewrite(Aig_Man_t *pAig,Dar_RwrPar_t *pPars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pObj;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  Dar_Man_t *p;
  Vec_Int_t *pVVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  Aig_Obj_t *pAVar10;
  Dar_RwrPar_t *pDVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  Dar_Cut_t *pCut;
  bool bVar15;
  timespec ts;
  int nMffcSize;
  timespec local_78;
  int local_64;
  long local_60;
  Aig_Man_t *local_58;
  ulong local_50;
  int local_44;
  Dar_RwrPar_t *local_40;
  ulong local_38;
  
  Dar_LibPrepare(pPars->nSubgMax);
  p = Dar_ManStart(pAig,pPars);
  local_40 = pPars;
  if (pPars->fPower != 0) {
    pVVar7 = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,1);
    pAig->vProbs = pVVar7;
  }
  Aig_ManCleanup(pAig);
  pDVar11 = p->pPars;
  if (pDVar11->fFanout != 0) {
    Aig_ManFanoutStart(pAig);
    pDVar11 = p->pPars;
  }
  if (pDVar11->fUpdateLevel != 0) {
    Aig_ManStartReverseLevels(pAig,0);
  }
  iVar5 = clock_gettime(3,&local_78);
  if (iVar5 < 0) {
    local_60 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    local_60 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  p->nNodesInit = pAig->nObjs[6] + pAig->nObjs[5];
  pVVar8 = pAig->vObjs;
  local_38 = (ulong)pVVar8->nSize;
  if (0 < (long)local_38) {
    uVar14 = 0;
    local_64 = 0;
    local_58 = pAig;
    do {
      pObj = (Aig_Obj_t *)pVVar8->pArray[uVar14];
      if (pObj != (Aig_Obj_t *)0x0) {
        if ((((uint)uVar14 >> 8 & 1) == 0) && (pAig->Time2Quit != 0)) {
          iVar5 = clock_gettime(3,&local_78);
          if (iVar5 < 0) {
            lVar12 = -1;
          }
          else {
            lVar12 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          if (pAig->Time2Quit < lVar12) break;
        }
        if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
          if (local_38 < uVar14) break;
          if (((local_40->fRecycle != 0) &&
              (iVar5 = local_64 * 0xbcbe61d, local_64 = local_64 + 1, uVar6 = iVar5 + 0xbd6626d,
              (uVar6 >> 4 | uVar6 * 0x10000000) < 0x14f8b)) &&
             (iVar5 = Aig_DagSize(pObj), iVar5 < p->vCutNodes->nSize / 100)) {
            Dar_ManCutsRestart(p,pObj);
          }
          p->nNodesTried = p->nNodesTried + 1;
          iVar5 = clock_gettime(3,&local_78);
          if (iVar5 < 0) {
            lVar12 = 1;
          }
          else {
            lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
            lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_78.tv_sec * -1000000;
          }
          if ((pObj->field_0x18 & 7) == 0) {
LAB_004f93c5:
            __assert_fail("!Aig_ObjIsNone(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darInt.h"
                          ,0x6c,"void Dar_ObjSetCuts(Aig_Obj_t *, Dar_Cut_t *)");
          }
          (pObj->field_5).pData = (void *)0x0;
          Dar_ObjComputeCuts_rec(p,pObj);
          iVar5 = clock_gettime(3,&local_78);
          if (iVar5 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
          }
          p->timeCuts = p->timeCuts + lVar13 + lVar12;
          uVar9 = *(ulong *)&pObj->field_0x18;
          if (0xffffffffffffff < uVar9) {
            pvVar4 = (pObj->field_5).pData;
            lVar12 = 0;
            do {
              uVar6 = *(uint *)((long)pvVar4 + lVar12 + 4);
              if ((uVar6 >> 0x1c & 1) != 0) {
                if (uVar6 < 0x20000000) {
                  if (((short)uVar6 != 0) && ((uVar6 & 0xffff) != 0xffff)) {
                    __assert_fail("pCut->uTruth == 0 || pCut->uTruth == 0xFFFF",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                                  ,0x98,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
                  }
                  pAVar10 = p->pAig->pConst1;
                  bVar15 = (short)uVar6 == 0;
LAB_004f9235:
                  if ((uVar9 & 7) == 0) goto LAB_004f93c5;
                  (pObj->field_5).pData = (void *)0x0;
                  Aig_ObjReplace(pAig,pObj,(Aig_Obj_t *)((ulong)pAVar10 ^ (ulong)bVar15),
                                 p->pPars->fUpdateLevel);
                  goto LAB_004f91fd;
                }
                if ((uVar6 & 0xe0000000) == 0x20000000) {
                  uVar1 = *(uint *)((long)pvVar4 + lVar12 + 8);
                  if ((uVar1 != pObj->Id) && (pVVar8 = p->pAig->vObjs, pVVar8 != (Vec_Ptr_t *)0x0))
                  {
                    if (((int)uVar1 < 0) || (pVVar8->nSize <= (int)uVar1)) {
LAB_004f93e4:
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                    }
                    if (pVVar8->pArray[uVar1] != (void *)0x0) {
                      uVar6 = uVar6 & 0xffff;
                      if ((uVar6 != 0x5555) && (uVar6 != 0xaaaa)) {
                        __assert_fail("pCut->uTruth == 0xAAAA || pCut->uTruth == 0x5555",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                                      ,0x9d,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
                      }
                      pVVar8 = p->pAig->vObjs;
                      if (pVVar8 == (Vec_Ptr_t *)0x0) {
                        pAVar10 = (Aig_Obj_t *)0x0;
                      }
                      else {
                        uVar1 = *(uint *)((long)pvVar4 + lVar12 + 8);
                        if (((int)uVar1 < 0) || (pVVar8->nSize <= (int)uVar1)) goto LAB_004f93e4;
                        pAVar10 = (Aig_Obj_t *)pVVar8->pArray[uVar1];
                      }
                      bVar15 = uVar6 == 0x5555;
                      goto LAB_004f9235;
                    }
                  }
                }
              }
              lVar12 = lVar12 + 0x18;
            } while ((uint)(byte)(uVar9 >> 0x38) * 0x18 != (int)lVar12);
          }
          p->GainBest = -1;
          local_44 = -1;
          if (pAig->vLevelR == (Vec_Int_t *)0x0) {
            iVar5 = 1000000000;
          }
          else {
            iVar5 = Aig_ObjRequiredLevel(pAig,pObj);
          }
          uVar9 = *(ulong *)&pObj->field_0x18;
          local_50 = uVar14;
          if (0xffffffffffffff < uVar9) {
            pCut = (Dar_Cut_t *)(pObj->field_5).pData;
            uVar6 = 0;
            do {
              uVar1 = *(uint *)&pCut->field_0x4;
              if ((uVar1 >> 0x1c & 1) != 0) {
                if ((uVar1 & 0xe0000000) == 0x60000000) {
                  *(uint *)&pCut->field_0x4 = uVar1 & 0x1fffffff | 0x80000000;
                  pCut->pLeaves[3] = 0;
                }
                Dar_LibEval(p,pObj,pCut,iVar5,&local_44);
                *(uint *)&pCut->field_0x4 =
                     *(uint *)&pCut->field_0x4 & 0x1fffffff | uVar1 & 0xe0000000;
                uVar9 = *(ulong *)&pObj->field_0x18;
              }
              uVar6 = uVar6 + 1;
              pCut = pCut + 1;
            } while (uVar6 < (byte)(uVar9 >> 0x38));
          }
          pAig = local_58;
          if ((0 < p->GainBest) ||
             ((uVar14 = local_50, p->GainBest == 0 && (p->pPars->fUseZeros != 0)))) {
            if ((uVar9 & 7) == 0) goto LAB_004f93c5;
            (pObj->field_5).pData = (void *)0x0;
            iVar2 = local_58->nObjs[5];
            iVar3 = local_58->nObjs[6];
            pAVar10 = Dar_LibBuildBest(p);
            if (iVar5 < (int)(*(uint *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x1c) & 0xffffff)) {
              __assert_fail("(int)Aig_Regular(pObjNew)->Level <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                            ,0xc0,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            Aig_ObjReplace(pAig,pObj,
                           (Aig_Obj_t *)
                           ((ulong)(((*(uint *)(((ulong)pAVar10 & 0xfffffffffffffffe) + 0x18) ^
                                     *(uint *)&pObj->field_0x18) >> 3 ^ (uint)pAVar10) & 1) ^
                           (ulong)pAVar10),p->pPars->fUpdateLevel);
            iVar5 = (iVar3 + iVar2) - (pAig->nObjs[5] + pAig->nObjs[6]);
            if (iVar5 < p->GainBest) {
              __assert_fail("p->GainBest <= nNodeBefore - nNodeAfter",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dar/darCore.c"
                            ,0xc5,"int Dar_ManRewrite(Aig_Man_t *, Dar_RwrPar_t *)");
            }
            p->ClassGains[p->ClassBest] = p->ClassGains[p->ClassBest] + iVar5;
            uVar14 = local_50;
          }
        }
      }
LAB_004f91fd:
      uVar14 = uVar14 + 1;
      pVVar8 = pAig->vObjs;
    } while ((long)uVar14 < (long)pVVar8->nSize);
  }
  iVar5 = clock_gettime(3,&local_78);
  if (iVar5 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
  }
  p->timeTotal = lVar12 + local_60;
  p->timeOther = (lVar12 + local_60) - (p->timeCuts + p->timeEval);
  Dar_ManCutsFree(p);
  pDVar11 = p->pPars;
  if (pDVar11->fFanout != 0) {
    Aig_ManFanoutStop(pAig);
    pDVar11 = p->pPars;
  }
  if (pDVar11->fUpdateLevel != 0) {
    Aig_ManStopReverseLevels(pAig);
  }
  pVVar7 = pAig->vProbs;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
    pAig->vProbs = (Vec_Int_t *)0x0;
  }
  Dar_ManStop(p);
  Aig_ManCheckPhase(pAig);
  iVar5 = Aig_ManCheck(pAig);
  if (iVar5 == 0) {
    puts("Aig_ManRewrite: The network check has failed.");
  }
  return (uint)(iVar5 != 0);
}

Assistant:

int Dar_ManRewrite( Aig_Man_t * pAig, Dar_RwrPar_t * pPars )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Dar_Man_t * p;
//    Bar_Progress_t * pProgress;
    Dar_Cut_t * pCut;
    Aig_Obj_t * pObj, * pObjNew;
    int i, k, nNodesOld, nNodeBefore, nNodeAfter, Required;
    abctime clk = 0, clkStart;
    int Counter = 0;
    int nMffcSize;//, nMffcGains[MAX_VAL+1][MAX_VAL+1] = {{0}};
    // prepare the library
    Dar_LibPrepare( pPars->nSubgMax ); 
    // create rewriting manager
    p = Dar_ManStart( pAig, pPars );
    if ( pPars->fPower )
        pAig->vProbs = Saig_ManComputeSwitchProbs( pAig, 48, 16, 1 );
    // remove dangling nodes
    Aig_ManCleanup( pAig );
    // if updating levels is requested, start fanout and timing
    if ( p->pPars->fFanout )
        Aig_ManFanoutStart( pAig );
    if ( p->pPars->fUpdateLevel )
        Aig_ManStartReverseLevels( pAig, 0 );
    // set elementary cuts for the PIs
//    Dar_ManCutsStart( p );
    // resynthesize each node once
    clkStart = Abc_Clock();
    p->nNodesInit = Aig_ManNodeNum(pAig);
    nNodesOld = Vec_PtrSize( pAig->vObjs );

//    pProgress = Bar_ProgressStart( stdout, nNodesOld );
    Aig_ManForEachObj( pAig, pObj, i )
//    pProgress = Bar_ProgressStart( stdout, 100 );
//    Aig_ManOrderStart( pAig );
//    Aig_ManForEachNodeInOrder( pAig, pObj )
    {
        if ( pAig->Time2Quit && !(i & 256) && Abc_Clock() > pAig->Time2Quit )
            break;
//        Bar_ProgressUpdate( pProgress, 100*pAig->nAndPrev/pAig->nAndTotal, NULL );
//        Bar_ProgressUpdate( pProgress, i, NULL );
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( i > nNodesOld )
//        if ( p->pPars->fUseZeros && i > nNodesOld )
            break;
        if ( pPars->fRecycle && ++Counter % 50000 == 0 && Aig_DagSize(pObj) < Vec_PtrSize(p->vCutNodes)/100 )
        {
//            printf( "Counter = %7d.  Node = %7d.  Dag = %5d. Vec = %5d.\n", 
//                Counter, i, Aig_DagSize(pObj), Vec_PtrSize(p->vCutNodes) );
//            fflush( stdout );
            Dar_ManCutsRestart( p, pObj );
        }

        // consider freeing the cuts
//        if ( (i & 0xFFF) == 0 && Aig_MmFixedReadMemUsage(p->pMemCuts)/(1<<20) > 100 )
//            Dar_ManCutsStart( p );

        // compute cuts for the node
        p->nNodesTried++;
clk = Abc_Clock();
        Dar_ObjSetCuts( pObj, NULL );
        Dar_ObjComputeCuts_rec( p, pObj );
p->timeCuts += Abc_Clock() - clk;

        // check if there is a trivial cut
        Dar_ObjForEachCut( pObj, pCut, k )
            if ( pCut->nLeaves == 0 || (pCut->nLeaves == 1 && pCut->pLeaves[0] != pObj->Id && Aig_ManObj(p->pAig, pCut->pLeaves[0])) )
                break;
        if ( k < (int)pObj->nCuts )
        {
            assert( pCut->nLeaves < 2 );
            if ( pCut->nLeaves == 0 ) // replace by constant
            {
                assert( pCut->uTruth == 0 || pCut->uTruth == 0xFFFF );
                pObjNew = Aig_NotCond( Aig_ManConst1(p->pAig), pCut->uTruth==0 );
            }
            else
            {
                assert( pCut->uTruth == 0xAAAA || pCut->uTruth == 0x5555 );
                pObjNew = Aig_NotCond( Aig_ManObj(p->pAig, pCut->pLeaves[0]), pCut->uTruth==0x5555 );
            }
            // remove the old cuts
            Dar_ObjSetCuts( pObj, NULL );
            // replace the node
            Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
            continue;
        }

        // evaluate the cuts
        p->GainBest = -1;
        nMffcSize   = -1;
        Required    = pAig->vLevelR? Aig_ObjRequiredLevel(pAig, pObj) : ABC_INFINITY;
        Dar_ObjForEachCut( pObj, pCut, k )
        {
            int nLeavesOld = pCut->nLeaves;
            if ( pCut->nLeaves == 3 )
                pCut->pLeaves[pCut->nLeaves++] = 0;
            Dar_LibEval( p, pObj, pCut, Required, &nMffcSize );
            pCut->nLeaves = nLeavesOld; 
        }
        // check the best gain
        if ( !(p->GainBest > 0 || (p->GainBest == 0 && p->pPars->fUseZeros)) )
        {
//            Aig_ObjOrderAdvance( pAig );
            continue;
        }
//        nMffcGains[p->GainBest < MAX_VAL ? p->GainBest : MAX_VAL][nMffcSize < MAX_VAL ? nMffcSize : MAX_VAL]++;
        // remove the old cuts
        Dar_ObjSetCuts( pObj, NULL );
        // if we end up here, a rewriting step is accepted
        nNodeBefore = Aig_ManNodeNum( pAig );
        pObjNew = Dar_LibBuildBest( p ); // pObjNew can be complemented!
        pObjNew = Aig_NotCond( pObjNew, Aig_ObjPhaseReal(pObjNew) ^ pObj->fPhase );
        assert( (int)Aig_Regular(pObjNew)->Level <= Required );
        // replace the node
        Aig_ObjReplace( pAig, pObj, pObjNew, p->pPars->fUpdateLevel );
        // compare the gains
        nNodeAfter = Aig_ManNodeNum( pAig );
        assert( p->GainBest <= nNodeBefore - nNodeAfter );
        // count gains of this class
        p->ClassGains[p->ClassBest] += nNodeBefore - nNodeAfter;
    }
//    Aig_ManOrderStop( pAig );
/*
    printf( "Distribution of gain (row) by MFFC size (column) %s 0-costs:\n", p->pPars->fUseZeros? "with":"without" );
    for ( k = 0; k <= MAX_VAL; k++ )
        printf( "<%4d> ", k );
    printf( "\n" );
    for ( i = 0; i <= MAX_VAL; i++ )
    {
        for ( k = 0; k <= MAX_VAL; k++ )
            printf( "%6d ", nMffcGains[i][k] );
        printf( "\n" );
    }
*/

p->timeTotal = Abc_Clock() - clkStart;
p->timeOther = p->timeTotal - p->timeCuts - p->timeEval;

//    Bar_ProgressStop( pProgress );
    Dar_ManCutsFree( p );
    // put the nodes into the DFS order and reassign their IDs
//    Aig_NtkReassignIds( p );
    // fix the levels
//    Aig_ManVerifyLevel( pAig );
    if ( p->pPars->fFanout )
        Aig_ManFanoutStop( pAig );
    if ( p->pPars->fUpdateLevel )
    {
//        Aig_ManVerifyReverseLevel( pAig );
        Aig_ManStopReverseLevels( pAig );
    }
    if ( pAig->vProbs )
    {
        Vec_IntFree( pAig->vProbs );
        pAig->vProbs = NULL;
    }
    // stop the rewriting manager
    Dar_ManStop( p );
    Aig_ManCheckPhase( pAig );
    // check
    if ( !Aig_ManCheck( pAig ) )
    {
        printf( "Aig_ManRewrite: The network check has failed.\n" );
        return 0;
    }
    return 1;
}